

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Entity_State_PDU::Decode(Entity_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  SeparationPart *pSVar4;
  KException *this_00;
  int iVar5;
  undefined7 in_register_00000011;
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
  *this_01;
  byte bVar6;
  pointer pKVar7;
  KUINT8 paramTyp;
  byte local_59;
  KString local_58;
  KUINT8 *local_38;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar5 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar5 = 0;
  }
  if (iVar5 + (uint)KVar3 < 0x90) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
    KException::KException(this_00,&local_58,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar1 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar7 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar7->_vptr_KRef_Ptr)(pKVar7);
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar2);
    (this->m_vVariableParameters).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  (*(this->m_EntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityID,stream);
  KDataStream::Read(stream,&this->m_ui8ForceID);
  local_38 = &this->m_ui8NumOfVariableParams;
  KDataStream::Read(stream,local_38);
  (*(this->m_EntityType).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EntityType,stream);
  (*(this->m_AltEntityType).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_AltEntityType,stream)
  ;
  (*(this->m_EntityLinearVelocity).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityLinearVelocity,stream);
  (*(this->m_EntityLocation).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityLocation,stream);
  (*(this->m_EntityOrientation).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityOrientation,stream);
  (*(this->m_EntityAppearance).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityAppearance,stream);
  (*(this->m_DeadReckoningParameter).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_DeadReckoningParameter,stream);
  (*(this->m_EntityMarking).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_EntityMarking,stream)
  ;
  (*(this->m_EntityCapabilities).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_EntityCapabilities,stream);
  if (this->m_ui8NumOfVariableParams != '\0') {
    this_01 = &this->m_vVariableParameters;
    bVar6 = 0;
    do {
      KVar3 = KDataStream::GetCurrentWritePosition(stream);
      KDataStream::Read(stream,&local_59);
      KDataStream::SetCurrentWritePosition(stream,KVar3);
      pSVar4 = (SeparationPart *)
               DATA_TYPE::FactoryDecoderUser<KDIS::DATA_TYPE::VariableParameter>::FactoryDecode
                         ((uint)local_59,stream);
      if (pSVar4 == (SeparationPart *)0x0) {
        if (local_59 == 3) {
          pSVar4 = (SeparationPart *)operator_new(0x48);
          DATA_TYPE::SeparationPart::SeparationPart(pSVar4,stream);
          local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00222870;
          local_58._M_string_length = (size_type)pSVar4;
          local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
          local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00222870;
          UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::unRef
                    ((KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
LAB_0013b205:
          pSVar4 = (SeparationPart *)operator_new(0x18);
          DATA_TYPE::VariableParameter::VariableParameter((VariableParameter *)pSVar4,stream);
          local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00222870;
          local_58._M_string_length = (size_type)pSVar4;
          local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
        }
        else if (local_59 == 1) {
          pSVar4 = (SeparationPart *)operator_new(0x30);
          DATA_TYPE::AttachedPart::AttachedPart((AttachedPart *)pSVar4,stream);
          local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00222870;
          local_58._M_string_length = (size_type)pSVar4;
          local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
        }
        else {
          if (local_59 != 0) goto LAB_0013b205;
          pSVar4 = (SeparationPart *)operator_new(0x28);
          DATA_TYPE::ArticulatedPart::ArticulatedPart((ArticulatedPart *)pSVar4,stream);
          local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00222870;
          local_58._M_string_length = (size_type)pSVar4;
          local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
          *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
          std::
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
          ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                    ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                      *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
        }
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00222870;
        local_58._M_string_length = (size_type)pSVar4;
        local_58.field_2._M_allocated_capacity = (size_type)operator_new(2);
        *(undefined2 *)local_58.field_2._M_allocated_capacity = 1;
        std::
        vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
        ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>
                  ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>>>
                    *)this_01,(KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
      }
      local_58._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00222870;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::VariableParameter> *)&local_58);
      bVar6 = bVar6 + 1;
    } while (bVar6 < *local_38);
  }
  return;
}

Assistant:

void Entity_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < ENTITY_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vVariableParameters.clear();

    Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_EntityID
           >> m_ui8ForceID
           >> m_ui8NumOfVariableParams
           >> KDIS_STREAM m_EntityType
           >> KDIS_STREAM m_AltEntityType
           >> KDIS_STREAM m_EntityLinearVelocity
           >> KDIS_STREAM m_EntityLocation
           >> KDIS_STREAM m_EntityOrientation
           >> KDIS_STREAM m_EntityAppearance
           >> KDIS_STREAM m_DeadReckoningParameter
           >> KDIS_STREAM m_EntityMarking
           >> KDIS_STREAM m_EntityCapabilities;

    for( KUINT8 i = 0; i < m_ui8NumOfVariableParams; ++i )
    {
        // Save the current write position so we can peek.
        KUINT16 pos = stream.GetCurrentWritePosition();
        KUINT8 paramTyp;

        // Extract the  type then reset the stream.
        stream >> paramTyp;
        stream.SetCurrentWritePosition( pos );

        // Use the factory decoder.
        VariableParameter * p = VariableParameter::FactoryDecode( paramTyp, stream );

        // Did we find a custom decoder? if not then use the default.
        if( p )
        {
            m_vVariableParameters.push_back( VarPrmPtr( p ) );
        }
        else
        {
            // Default internals
            switch( paramTyp )
            {
                case ArticulatedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new ArticulatedPart( stream ) ) );
                    break;

                case AttachedPartType:
                    m_vVariableParameters.push_back( VarPrmPtr( new AttachedPart( stream ) ) );
                    break;

                #if DIS_VERSION > 5
                case SeparationPartType:
                    m_vVariableParameters.push_back(VarPrmPtr(new SeparationPart(stream)));
                #endif

                default:
                    m_vVariableParameters.push_back( VarPrmPtr( new VariableParameter( stream ) ) );
                    break;
            }
        }
    }
}